

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O1

void If_Dec08MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  word *pwVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  word *pwVar11;
  ulong uVar12;
  word *pwVar13;
  ulong uVar14;
  int iVar15;
  word pG [16];
  word local_b8 [17];
  
  if (p < Var2Pla[v]) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0xf4,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  iVar15 = Var2Pla[v];
  bVar5 = true;
  pwVar13 = pF;
  if (iVar15 != p) {
    uVar8 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar8 = 1;
    }
    pwVar7 = pF;
    pwVar11 = local_b8;
    bVar10 = 0;
    do {
      bVar6 = bVar10;
      pwVar13 = pwVar11;
      pwVar11 = pwVar7;
      if (nVars + -1 <= iVar15) {
        __assert_fail("iVar < nVars - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                      ,0xcf,"void If_Dec08SwapAdjacent(word *, word *, int, int)");
      }
      if (iVar15 < 5) {
        if (0 < (int)uVar8) {
          uVar12 = PMasks[iVar15][0];
          uVar2 = PMasks[iVar15][1];
          uVar3 = PMasks[iVar15][2];
          uVar14 = 0;
          do {
            uVar4 = pwVar11[uVar14];
            bVar10 = (byte)(1 << ((byte)iVar15 & 0x1f));
            pwVar13[uVar14] =
                 (uVar4 & uVar3) >> (bVar10 & 0x3f) |
                 (uVar4 & uVar2) << (bVar10 & 0x3f) | uVar4 & uVar12;
            uVar14 = uVar14 + 1;
          } while (uVar8 != uVar14);
        }
      }
      else if (iVar15 == 5) {
        if (0 < (int)uVar8) {
          uVar12 = 0;
          do {
            uVar2 = pwVar11[uVar12];
            uVar3 = pwVar11[uVar12 + 1];
            pwVar13[uVar12] = uVar3 << 0x20 | uVar2 & 0xffffffff;
            pwVar13[uVar12 + 1] = uVar2 >> 0x20 | uVar3 & 0xffffffff00000000;
            uVar12 = uVar12 + 2;
          } while (uVar12 < uVar8);
        }
      }
      else if (0 < (int)uVar8) {
        lVar9 = 0;
        do {
          pwVar13[lVar9] = pwVar11[lVar9];
          pwVar13[lVar9 + 1] = pwVar11[lVar9 + 2];
          pwVar13[lVar9 + 2] = pwVar11[lVar9 + 1];
          pwVar13[lVar9 + 3] = pwVar11[lVar9 + 3];
          lVar9 = lVar9 + 4;
        } while ((int)lVar9 < (int)uVar8);
      }
      Var2Pla[Pla2Var[iVar15]] = Var2Pla[Pla2Var[iVar15]] + 1;
      Var2Pla[Pla2Var[(long)iVar15 + 1]] = Var2Pla[Pla2Var[(long)iVar15 + 1]] + -1;
      puVar1 = (ulong *)(Pla2Var + iVar15);
      *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
      iVar15 = Var2Pla[v];
      pwVar7 = pwVar13;
      bVar10 = bVar6 + 1;
    } while (iVar15 != p);
    bVar5 = (bool)(bVar6 & 1);
  }
  if (!bVar5) {
    uVar8 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar8 = 1;
    }
    if (0 < (int)uVar8) {
      uVar12 = 0;
      do {
        pF[uVar12] = pwVar13[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
    }
  }
  if (Pla2Var[(uint)p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0x104,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec08MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec08SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec08Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}